

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSGlobalVar * add_global_var(JSContext *ctx,JSFunctionDef *s,JSAtom name)

{
  JSGlobalVar *pJVar1;
  JSAtomStruct *pJVar2;
  int iVar3;
  
  if ((s->global_var_size <= s->global_var_count) &&
     (iVar3 = js_realloc_array(ctx,&s->global_vars,0x10,&s->global_var_size,s->global_var_count + 1)
     , iVar3 != 0)) {
    return (JSGlobalVar *)0x0;
  }
  pJVar1 = s->global_vars;
  iVar3 = s->global_var_count;
  s->global_var_count = iVar3 + 1;
  pJVar1[iVar3].cpool_idx = -1;
  pJVar1[iVar3].field_0x4 = pJVar1[iVar3].field_0x4 & 0xf8;
  pJVar1[iVar3].scope_level = s->scope_level;
  if (0xd1 < (int)name) {
    pJVar2 = ctx->rt->atom_array[name];
    (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
  }
  pJVar1[iVar3].var_name = name;
  return pJVar1 + iVar3;
}

Assistant:

static JSGlobalVar *add_global_var(JSContext *ctx, JSFunctionDef *s,
                                     JSAtom name)
{
    JSGlobalVar *hf;

    if (js_resize_array(ctx, (void **)&s->global_vars,
                        sizeof(s->global_vars[0]),
                        &s->global_var_size, s->global_var_count + 1))
        return NULL;
    hf = &s->global_vars[s->global_var_count++];
    hf->cpool_idx = -1;
    hf->force_init = FALSE;
    hf->is_lexical = FALSE;
    hf->is_const = FALSE;
    hf->scope_level = s->scope_level;
    hf->var_name = JS_DupAtom(ctx, name);
    return hf;
}